

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGFreeParserCtxt(xmlRelaxNGParserCtxtPtr ctxt)

{
  int i;
  long lVar1;
  
  if (ctxt != (xmlRelaxNGParserCtxtPtr)0x0) {
    if (ctxt->URL != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->URL);
    }
    if (ctxt->doc != (xmlRelaxNGDocumentPtr_conflict)0x0) {
      xmlRelaxNGFreeDocument(ctxt->doc);
    }
    if (ctxt->interleaves != (xmlHashTablePtr)0x0) {
      xmlHashFree(ctxt->interleaves,(xmlHashDeallocator)0x0);
    }
    if (ctxt->documents != (xmlRelaxNGDocumentPtr_conflict)0x0) {
      xmlRelaxNGFreeDocumentList(ctxt->documents);
    }
    if (ctxt->includes != (xmlRelaxNGIncludePtr_conflict)0x0) {
      xmlRelaxNGFreeIncludeList(ctxt->includes);
    }
    if (ctxt->docTab != (xmlRelaxNGDocumentPtr_conflict *)0x0) {
      (*xmlFree)(ctxt->docTab);
    }
    if (ctxt->incTab != (xmlRelaxNGIncludePtr_conflict *)0x0) {
      (*xmlFree)(ctxt->incTab);
    }
    if (ctxt->defTab != (xmlRelaxNGDefinePtr_conflict *)0x0) {
      for (lVar1 = 0; lVar1 < ctxt->defNr; lVar1 = lVar1 + 1) {
        xmlRelaxNGFreeDefine(ctxt->defTab[lVar1]);
      }
      (*xmlFree)(ctxt->defTab);
    }
    if ((ctxt->document != (xmlDocPtr)0x0) && (ctxt->freedoc != 0)) {
      xmlFreeDoc(ctxt->document);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlRelaxNGFreeParserCtxt(xmlRelaxNGParserCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->URL != NULL)
        xmlFree(ctxt->URL);
    if (ctxt->doc != NULL)
        xmlRelaxNGFreeDocument(ctxt->doc);
    if (ctxt->interleaves != NULL)
        xmlHashFree(ctxt->interleaves, NULL);
    if (ctxt->documents != NULL)
        xmlRelaxNGFreeDocumentList(ctxt->documents);
    if (ctxt->includes != NULL)
        xmlRelaxNGFreeIncludeList(ctxt->includes);
    if (ctxt->docTab != NULL)
        xmlFree(ctxt->docTab);
    if (ctxt->incTab != NULL)
        xmlFree(ctxt->incTab);
    if (ctxt->defTab != NULL) {
        int i;

        for (i = 0; i < ctxt->defNr; i++)
            xmlRelaxNGFreeDefine(ctxt->defTab[i]);
        xmlFree(ctxt->defTab);
    }
    if ((ctxt->document != NULL) && (ctxt->freedoc))
        xmlFreeDoc(ctxt->document);
    xmlFree(ctxt);
}